

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

double soplex::LPFreadInfinity<double>(char **pos)

{
  char cVar1;
  double *pdVar2;
  double dVar3;
  
  cVar1 = **pos;
  *pos = *pos + 1;
  LPFhasKeyword(pos,"inf[inity]");
  pdVar2 = (double *)infinity();
  dVar3 = *pdVar2;
  if (cVar1 == '-') {
    dVar3 = -dVar3;
  }
  return dVar3;
}

Assistant:

static R LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   R sense = (*pos == '-') ? -1.0 : 1.0;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   return sense * R(infinity);
}